

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O2

MPP_RET av1d_parser_init(Av1CodecContext *ctx,ParserCfg *init)

{
  MppBufSlots slots;
  void *pvVar1;
  void *pvVar2;
  ulong uVar3;
  MppFrame *frame;
  
  if (((byte)av1d_debug & 1) != 0) {
    _mpp_log_l(4,"av1d_parser","enter ctx %p\n","av1d_parser_init",ctx);
  }
  pvVar1 = mpp_osal_calloc("av1d_parser_init",0x1dbe8);
  ctx->priv_data = pvVar1;
  if (pvVar1 == (void *)0x0) {
    _mpp_log_l(2,"av1d_parser","av1d codec context malloc fail",(char *)0x0);
  }
  else {
    pvVar2 = mpp_osal_calloc("av1d_parser_init",0x24c);
    *(void **)((long)pvVar1 + 0x60) = pvVar2;
    *(Av1UnitType **)((long)pvVar1 + 0x1cfb8) = unit_types;
    *(undefined4 *)((long)pvVar1 + 0x1cfc0) = 6;
    *(MppBufSlots *)((long)pvVar1 + 0x1dbb0) = init->packet_slots;
    slots = init->frame_slots;
    *(MppBufSlots *)((long)pvVar1 + 0x1dba8) = slots;
    *(MppDecCfgSet **)((long)pvVar1 + 0x1dbc0) = init->cfg;
    *(MppDecHwCap **)((long)pvVar1 + 0x1dbe0) = init->hw_info;
    mpp_buf_slot_setup(slots,0x19);
    mpp_env_get_u32("av1d_debug",&av1d_debug,0);
    frame = (MppFrame *)((long)pvVar1 + 0xa8);
    for (uVar3 = 0; uVar3 != 8; uVar3 = uVar3 + 1) {
      mpp_frame_init(frame);
      if (*frame == (MppFrame)0x0) {
        uVar3 = uVar3 & 0xffffffff;
        goto LAB_001b3226;
      }
      *(undefined4 *)(frame + 1) = 0x7f;
      frame[0x5e] = (MppFrame)0x0;
      frame = frame + 0x5f;
    }
    mpp_frame_init((MppFrame *)((long)pvVar1 + 0x1868));
    *(undefined8 *)((long)pvVar1 + 7000) = 0;
    *(undefined4 *)((long)pvVar1 + 0x1870) = 0xff;
    if (*(long *)((long)pvVar1 + 0x1868) != 0) {
      *(AV1CDFs **)((long)pvVar1 + 0x1be8) = (AV1CDFs *)((long)pvVar1 + 0x1bf8);
      *(MvCDFs **)((long)pvVar1 + 0x1bf0) = (MvCDFs *)((long)pvVar1 + 0x4bd8);
      AV1SetDefaultCDFs((AV1CDFs *)((long)pvVar1 + 0x1bf8),(MvCDFs *)((long)pvVar1 + 0x4bd8));
      return MPP_OK;
    }
    uVar3 = 8;
LAB_001b3226:
    _mpp_log_l(2,"av1d_parser","Failed to allocate frame buffer %d\n",(char *)0x0,uVar3);
  }
  return MPP_ERR_NOMEM;
}

Assistant:

MPP_RET av1d_parser_init(Av1CodecContext *ctx, ParserCfg *init)
{
    MPP_RET ret = MPP_OK;
    RK_S32 i = 0;
    av1d_dbg_func("enter ctx %p\n", ctx);
    AV1Context *s = mpp_calloc(AV1Context, 1);
    ctx->priv_data = (void*)s;
    if (!ctx->priv_data) {
        mpp_err("av1d codec context malloc fail");
        return MPP_ERR_NOMEM;
    }

    s->seq_ref = mpp_calloc(AV1RawSequenceHeader, 1);

    s->unit_types = unit_types;
    s->nb_unit_types = MPP_ARRAY_ELEMS(unit_types);
    s->packet_slots = init->packet_slots;
    s->slots = init->frame_slots;
    s->cfg = init->cfg;
    s->hw_info = init->hw_info;
    mpp_buf_slot_setup(s->slots, 25);

    mpp_env_get_u32("av1d_debug", &av1d_debug, 0);
    for (i = 0; i < AV1_NUM_REF_FRAMES; i++) {
        mpp_frame_init(&s->ref[i].f);
        if (!s->ref[i].f) {
            mpp_err("Failed to allocate frame buffer %d\n", i);
            return MPP_ERR_NOMEM;
        }
        s->ref[i].slot_index = 0x7f;
        s->ref[i].ref = NULL;
    }

    mpp_frame_init(&s->cur_frame.f);
    s->cur_frame.ref = NULL;
    s->cur_frame.slot_index = 0xff;
    if (!s->cur_frame.f) {
        mpp_err("Failed to allocate frame buffer %d\n", i);
        return MPP_ERR_NOMEM;
    }
    s->cdfs = &s->default_cdfs;
    s->cdfs_ndvc = &s->default_cdfs_ndvc;
    AV1SetDefaultCDFs(s->cdfs, s->cdfs_ndvc);

    return MPP_OK;

    av1d_dbg_func("leave ctx %p\n", ctx);

    return ret;
}